

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

int P_Set3DFloor(line_t *line,int param,int param2,int alpha)

{
  int iVar1;
  sector_t *sec2;
  line_t *plVar2;
  side_t *psVar3;
  ushort uVar4;
  uint uVar5;
  FDynamicColormap *pFVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  sector_t *sec;
  FSectorTagIterator itr;
  
  itr.searchtag = line->args[0];
  sec2 = line->frontsector;
  itr.start = 0;
  if ((ulong)(uint)itr.searchtag != 0) {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)itr.searchtag & 0xff];
  }
  uVar11 = 0x420d;
  if ((param & 4U) == 0) {
    uVar11 = 0xd;
  }
  uVar7 = (param2 & 0x400U) << 0x15 | (param2 & 0x200U) << 0x12;
  do {
    uVar5 = FSectorTagIterator::Next(&itr);
    if ((int)uVar5 < 0) {
      psVar3 = line->sidedef[0];
      if (psVar3->textures[0].texture.texnum < 1) {
        psVar3->textures[0].texture.texnum = 0;
      }
      return (int)psVar3;
    }
    sec = sectors + uVar5;
    uVar10 = (param2 & 1U) << 0x19 | 0x202029;
    uVar5 = 0xff;
    if (param != 4) {
      if (param == 0) {
        uVar4 = sec2->linecount;
        if (sec2->linecount < 1) {
          uVar4 = 0;
        }
        for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
          plVar2 = sec2->lines[uVar8];
          if ((plVar2->special == 0xa1) && (plVar2->frontsector == sec2)) {
            iVar1 = plVar2->args[1];
            uVar5 = plVar2->args[2];
            iVar12 = iVar1;
            if (99 < iVar1) {
              iVar12 = 100;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar10 = (uint)(iVar1 < 100) * 0x800 +
                     ((uVar5 & 6) << 0x18 | (uVar5 & 8) << 0x19) + (uint)((uVar5 & 1) == 0) * 2 +
                     0x40000d;
            if ((long)plVar2->args[0] != 0) {
              uVar10 = uVar10 | 0x20004210;
              pFVar6 = plVar2->frontsector->ColorMap;
              pFVar6 = GetSpecialLights((PalEntry)(pFVar6->Color).field_0.field_0,
                                        (PalEntry)
                                        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)
                                        (P_Set3DFloor::vavoomcolors + plVar2->args[0]))->field_0,
                                        pFVar6->Desaturate);
              plVar2->frontsector->ColorMap = pFVar6;
            }
            uVar5 = (iVar12 * 0xff & 0xffffU) / 100;
            goto LAB_0047664e;
          }
        }
        uVar10 = 0x40000f;
      }
      else {
        uVar10 = (P_Set3DFloor::defflags[param & 3] | uVar11) ^ (param & 0x30U) << 0x15 |
                 (param2 & 0x30U) << 0xd |
                 (param2 & 8U) << 0x10 |
                 (param2 & 4U) << 10 | (param2 & 2U) << 0xf | (param2 & 1U) << 5;
        uVar5 = uVar10 | 0x10000800;
        if ((param2 & 0x40U) == 0) {
          uVar5 = uVar10;
        }
        uVar9 = uVar5 | 0x26000000;
        if ((uVar5 & 2) != 0) {
          uVar9 = uVar5;
        }
        if (-1 < (char)param2) {
          uVar9 = uVar5;
        }
        uVar10 = uVar9 | uVar7;
        iVar1 = line->sidedef[0]->textures[0].texture.texnum;
        uVar5 = -iVar1;
        if (-1 < iVar1) {
          uVar5 = alpha;
        }
        if (0xfe < alpha) {
          uVar5 = alpha;
        }
        if (0xfe < (int)uVar5) {
          uVar5 = 0xff;
        }
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        if (uVar5 != 0xff) {
          if (uVar5 == 0) {
            uVar10 = uVar9 & 0xffffbdf3 | uVar7;
            uVar5 = 0;
          }
          else {
            uVar10 = uVar10 | 0x800;
          }
        }
      }
    }
LAB_0047664e:
    alpha = uVar5;
    P_Add3DFloor(sec,sec2,line,uVar10,alpha);
  } while( true );
}

Assistant:

static int P_Set3DFloor(line_t * line, int param, int param2, int alpha)
{
	int s, i;
	int flags;
	int tag = line->args[0];
	sector_t * sec = line->frontsector, *ss;

	FSectorTagIterator itr(tag);
	while ((s = itr.Next()) >= 0)
	{
		ss = &sectors[s];

		if (param == 0)
		{
			flags = FF_EXISTS | FF_RENDERALL | FF_SOLID | FF_INVERTSECTOR;
			alpha = 255;
			for (i = 0; i < sec->linecount; i++)
			{
				line_t * l = sec->lines[i];

				if (l->special == Sector_SetContents && l->frontsector == sec)
				{
					alpha = clamp<int>(l->args[1], 0, 100);
					if (l->args[2] & 1) flags &= ~FF_SOLID;
					if (l->args[2] & 2) flags |= FF_SEETHROUGH;
					if (l->args[2] & 4) flags |= FF_SHOOTTHROUGH;
					if (l->args[2] & 8) flags |= FF_ADDITIVETRANS;
					if (alpha != 100) flags |= FF_TRANSLUCENT;//|FF_BOTHPLANES|FF_ALLSIDES;
					if (l->args[0])
					{
						// Yes, Vavoom's 3D-floor definitions suck!
						// The content list changed in r1783 of Vavoom to be unified
						// among all its supported games, so it has now ten different
						// values instead of just five.
						static DWORD vavoomcolors[] = { VC_EMPTY,
							VC_WATER, VC_LAVA, VC_NUKAGE, VC_SLIME, VC_HELLSLIME,
							VC_BLOOD, VC_SLUDGE, VC_HAZARD, VC_BOOMWATER };
						flags |= FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_FLOOD;

						l->frontsector->ColorMap =
							GetSpecialLights(l->frontsector->ColorMap->Color,
							vavoomcolors[l->args[0]],
							l->frontsector->ColorMap->Desaturate);
					}
					alpha = (alpha * 255) / 100;
					break;
				}
			}
		}
		else if (param == 4)
		{
			flags = FF_EXISTS | FF_RENDERPLANES | FF_INVERTPLANES | FF_NOSHADE | FF_FIX;
			if (param2 & 1) flags |= FF_SEETHROUGH;	// marker for allowing missing texture checks
			alpha = 255;
		}
		else
		{
			static const int defflags[] = { 0,
				FF_SOLID,
				FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_SHOOTTHROUGH | FF_SEETHROUGH,
				FF_SHOOTTHROUGH | FF_SEETHROUGH,
			};

			flags = defflags[param & 3] | FF_EXISTS | FF_RENDERALL;

			if (param & 4) flags |= FF_ALLSIDES | FF_BOTHPLANES;
			if (param & 16) flags ^= FF_SEETHROUGH;
			if (param & 32) flags ^= FF_SHOOTTHROUGH;

			if (param2 & 1) flags |= FF_NOSHADE;
			if (param2 & 2) flags |= FF_DOUBLESHADOW;
			if (param2 & 4) flags |= FF_FOG;
			if (param2 & 8) flags |= FF_THINFLOOR;
			if (param2 & 16) flags |= FF_UPPERTEXTURE;
			if (param2 & 32) flags |= FF_LOWERTEXTURE;
			if (param2 & 64) flags |= FF_ADDITIVETRANS | FF_TRANSLUCENT;
			// if flooding is used the floor must be non-solid and is automatically made shootthrough and seethrough
			if ((param2 & 128) && !(flags & FF_SOLID)) flags |= FF_FLOOD | FF_SEETHROUGH | FF_SHOOTTHROUGH;
			if (param2 & 512) flags |= FF_FADEWALLS;
			if (param2&1024) flags |= FF_RESET;
			FTextureID tex = line->sidedef[0]->GetTexture(side_t::top);
			if (!tex.Exists() && alpha < 255)
			{
				alpha = -tex.GetIndex();
			}
			alpha = clamp(alpha, 0, 255);
			if (alpha == 0) flags &= ~(FF_RENDERALL | FF_BOTHPLANES | FF_ALLSIDES);
			else if (alpha != 255) flags |= FF_TRANSLUCENT;

		}
		P_Add3DFloor(ss, sec, line, flags, alpha);
	}
	// To be 100% safe this should be done even if the alpha by texture value isn't used.
	if (!line->sidedef[0]->GetTexture(side_t::top).isValid())
		line->sidedef[0]->SetTexture(side_t::top, FNullTextureID());
	return 1;
}